

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void set_text_leaf_parts(Am_Object *obj,Am_Style *new_style)

{
  Am_Style *this;
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object local_50;
  Am_Object part;
  Am_Value_List parts;
  Am_Object local_20;
  Am_Style *local_18;
  Am_Style *new_style_local;
  Am_Object *obj_local;
  
  local_18 = new_style;
  new_style_local = (Am_Style *)obj;
  Am_Object::Am_Object(&local_20,&Am_Text);
  bVar1 = Am_Object::Is_Instance_Of(obj,&local_20);
  Am_Object::~Am_Object(&local_20);
  this = new_style_local;
  if (bVar1) {
    value = Am_Style::operator_cast_to_Am_Wrapper_(local_18);
    Am_Object::Set((Am_Object *)this,0x6a,value,0);
  }
  else {
    Am_Object::Am_Object((Am_Object *)&parts.item,&Am_Group);
    bVar1 = Am_Object::Is_Instance_Of((Am_Object *)this,(Am_Object *)&parts.item);
    Am_Object::~Am_Object((Am_Object *)&parts.item);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"Bad part ");
      poVar3 = operator<<(poVar3,(Am_Object *)new_style_local);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    pAVar2 = Am_Object::Get((Am_Object *)new_style_local,0x82,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)&part,pAVar2);
    Am_Object::Am_Object(&local_50);
    Am_Value_List::Start((Am_Value_List *)&part);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)&part);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pAVar2 = Am_Value_List::Get((Am_Value_List *)&part);
      Am_Object::operator=(&local_50,pAVar2);
      set_text_leaf_parts(&local_50,local_18);
      Am_Value_List::Next((Am_Value_List *)&part);
    }
    Am_Object::~Am_Object(&local_50);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&part);
  }
  return;
}

Assistant:

void
set_text_leaf_parts(Am_Object &obj, Am_Style &new_style)
{
  if (obj.Is_Instance_Of(Am_Text)) {
    obj.Set(Am_FILL_STYLE, new_style);
  } else if (obj.Is_Instance_Of(Am_Group)) {
    Am_Value_List parts = obj.Get(Am_GRAPHICAL_PARTS);
    Am_Object part;
    for (parts.Start(); !parts.Last(); parts.Next()) {
      part = parts.Get();
      set_text_leaf_parts(part, new_style);
    }
  } else
    Am_ERROR("Bad part " << obj);
}